

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSize(CodeGeneratorResponse *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  int iVar3;
  Type *value;
  int i;
  int iVar4;
  
  iVar4 = 0;
  iVar2 = 0;
  if ((this->_has_bits_[0] & 1) != 0) {
    iVar2 = internal::WireFormatLite::StringSize(this->error_);
    iVar2 = iVar2 + 1;
  }
  iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3;
  for (; iVar4 < iVar3; iVar4 = iVar4 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                      (&(this->file_).super_RepeatedPtrFieldBase,iVar4);
    iVar3 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::compiler::CodeGeneratorResponse_File>(value);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar2 + iVar4;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int CodeGeneratorResponse::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string error = 1;
    if (has_error()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->error());
    }

  }
  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  total_size += 1 * this->file_size();
  for (int i = 0; i < this->file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}